

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O0

void * IsoSpec::quickselect(void **array,int n,int start,int end)

{
  int iVar1;
  result_type_conflict rVar2;
  int in_ECX;
  int in_EDX;
  long lVar3;
  int in_ESI;
  long in_RDI;
  double dVar4;
  double dVar5;
  int i;
  int loweridx;
  double pprob;
  void *pval;
  size_t pivot;
  int len;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 local_1c;
  undefined4 local_18;
  undefined8 local_8;
  
  iVar1 = in_ECX;
  local_18 = in_EDX;
  if (in_EDX == in_ECX) {
    local_8 = *(void **)(in_RDI + (long)in_EDX * 8);
  }
  else {
    while( true ) {
      local_1c = iVar1;
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      lVar3 = rVar2 % (ulong)(long)(local_1c - local_18) + (long)local_18;
      dVar4 = getLProb(*(void **)(in_RDI + lVar3 * 8));
      std::swap<void*>((void **)(in_RDI + lVar3 * 8),(void **)(in_RDI + (long)(local_1c + -1) * 8));
      in_stack_ffffffffffffffc4 = local_18;
      for (in_stack_ffffffffffffffc0 = local_18; in_stack_ffffffffffffffc0 < local_1c + -1;
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
        dVar5 = getLProb(*(void **)(in_RDI + (long)in_stack_ffffffffffffffc0 * 8));
        if (dVar5 < dVar4) {
          std::swap<void*>((void **)(in_RDI + (long)in_stack_ffffffffffffffc0 * 8),
                           (void **)(in_RDI + (long)in_stack_ffffffffffffffc4 * 8));
          in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1;
        }
      }
      std::swap<void*>((void **)(in_RDI + (long)(local_1c + -1) * 8),
                       (void **)(in_RDI + (long)in_stack_ffffffffffffffc4 * 8));
      if (in_ESI == in_stack_ffffffffffffffc4) break;
      iVar1 = in_stack_ffffffffffffffc4;
      if (in_stack_ffffffffffffffc4 <= in_ESI) {
        local_18 = in_stack_ffffffffffffffc4 + 1;
        iVar1 = local_1c;
      }
    }
    local_8 = *(void **)(in_RDI + (long)in_ESI * 8);
  }
  return local_8;
}

Assistant:

void* quickselect(void ** array, int n, int start, int end)
{
    if(start == end)
        return array[start];

    while(true)
    {
        // Partition part
        int len = end - start;
#if ISOSPEC_BUILDING_R
        int pivot = len/2 + start;
#else
        size_t pivot = random_gen() % len + start;  // Using Mersenne twister directly - we don't
                                                    // need a very uniform distribution just for pivot
                                                    // selection
#endif
        void* pval = array[pivot];
        double pprob = getLProb(pval);
        std::swap(array[pivot], array[end-1]);
        int loweridx = start;
        for(int i = start; i < end-1; i++)
        {
            if(getLProb(array[i]) < pprob)
            {
                std::swap(array[i], array[loweridx]);
                loweridx++;
            }
        }
        std::swap(array[end-1], array[loweridx]);

        // Selection part
        if(n == loweridx)
            return array[n];
        if(n < loweridx)
            end = loweridx;
        else
            start = loweridx+1;
    };
}